

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Security.cpp
# Opt level: O2

void __thiscall Security::EncodeLargeConstants(Security *this)

{
  Instr *pIVar1;
  Opnd *this_00;
  Opnd *opnd;
  Opnd *opnd_00;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  LabelInstr *pLVar7;
  Type *ppBVar8;
  uint uVar9;
  Instr *local_70;
  
  uVar4 = Func::GetSourceContextId(this->func);
  uVar5 = Func::GetLocalFunctionId(this->func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,EncodeConstantsPhase,uVar4,uVar5);
  if ((!bVar2) &&
     (bVar2 = Js::ConfigFlagsTable::IsEnabled
                        ((ConfigFlagsTable *)&Js::Configuration::Global,DebugFlag), !bVar2)) {
    pIVar1 = this->func->m_headInstr;
LAB_005b1bbc:
    local_70 = pIVar1;
    if (local_70 != (Instr *)0x0) {
      pIVar1 = local_70->m_next;
      bVar2 = IR::Instr::IsRealInstr(local_70);
      if (!bVar2) {
        if ((local_70->m_kind == InstrKindProfiledLabel) || (local_70->m_kind == InstrKindLabel)) {
          pLVar7 = IR::Instr::AsLabelInstr(local_70);
          uVar6 = (pLVar7->labelRefs).
                  super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                  super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                  super_RealCount.count;
          if ((1 < uVar6) ||
             ((uVar6 == 1 &&
              (ppBVar8 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::Head
                                   ((SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>
                                     *)&pLVar7->labelRefs),
              *ppBVar8 != (Type)(pLVar7->super_Instr).m_prev)))) {
            if (this->cookieOpnd != (IntConstOpnd *)0x0) {
              IR::Opnd::Free(&this->cookieOpnd->super_Opnd,this->func);
            }
            this->basePlusCookieOpnd = (RegOpnd *)0x0;
            this->cookieOpnd = (IntConstOpnd *)0x0;
            this->baseOpnd = (RegOpnd *)0x0;
          }
        }
        goto LAB_005b1bbc;
      }
      this_00 = local_70->m_dst;
      opnd = local_70->m_src1;
      opnd_00 = local_70->m_src2;
      uVar4 = 0;
      if (this_00 != (Opnd *)0x0) {
        if ((this->baseOpnd != (RegOpnd *)0x0) &&
           (bVar2 = IR::Opnd::IsEqual(this_00,&this->baseOpnd->super_Opnd), bVar2)) {
          if (this->cookieOpnd != (IntConstOpnd *)0x0) {
            IR::Opnd::Free(&this->cookieOpnd->super_Opnd,this->func);
          }
          this->basePlusCookieOpnd = (RegOpnd *)0x0;
          this->cookieOpnd = (IntConstOpnd *)0x0;
          this->baseOpnd = (RegOpnd *)0x0;
        }
        uVar4 = CalculateConstSize(this_00);
      }
      if (opnd == (Opnd *)0x0) {
        uVar5 = 0;
LAB_005b1cd3:
        uVar6 = 0;
      }
      else {
        uVar5 = CalculateConstSize(opnd);
        if (opnd_00 == (Opnd *)0x0) goto LAB_005b1cd3;
        uVar6 = CalculateConstSize(opnd_00);
      }
      uVar9 = uVar5 + uVar4 + uVar6;
      if ((uVar9 < 3) &&
         (bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01436260,EncodeConstantsPhase), !bVar2))
      goto LAB_005b1bbc;
      if (uVar4 < 2) {
        bVar2 = false;
      }
      else {
        if ((uVar4 == uVar5 && opnd != (Opnd *)0x0) &&
           (bVar2 = IR::Opnd::IsEqual(opnd,this_00), bVar2)) {
          uVar9 = uVar9 - uVar4;
          bVar2 = true;
          if ((uVar9 < 3) &&
             (bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01436260,EncodeConstantsPhase), !bVar3))
          goto LAB_005b1bbc;
        }
        else {
          bVar2 = false;
        }
        EncodeOpnd(this,local_70,this_00);
        if (bVar2) {
          IR::Instr::ReplaceSrc1(local_70,this_00);
        }
        uVar9 = uVar9 - uVar4;
        if ((uVar9 < 3) &&
           (bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01436260,EncodeConstantsPhase), !bVar3))
        goto LAB_005b1bbc;
      }
      if ((uVar5 < 2) || ((bVar2 || (EncodeOpnd(this,local_70,opnd), 2 < uVar9 - uVar5)))) {
        if (uVar6 < 2) goto LAB_005b1bbc;
      }
      else {
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01436260,EncodeConstantsPhase);
        if ((uVar6 < 2) || (!bVar2)) goto LAB_005b1bbc;
      }
      EncodeOpnd(this,local_70,opnd_00);
      goto LAB_005b1bbc;
    }
  }
  return;
}

Assistant:

void
Security::EncodeLargeConstants()
{
#pragma prefast(suppress:6236 6285, "logical-or of constants is by design")
    if (PHASE_OFF(Js::EncodeConstantsPhase, this->func) || CONFIG_ISENABLED(Js::DebugFlag) || !MD_ENCODE_LG_CONSTS)
    {
        return;
    }

    uint prevInstrConstSize = 0;
    FOREACH_INSTR_IN_FUNC_EDITING(instr, instrNext, this->func)
    {
        if (!instr->IsRealInstr())
        {
            if (instr->IsLabelInstr())
            {
                IR::LabelInstr * label = instr->AsLabelInstr();

                if (label->labelRefs.Count() > 1 || (label->labelRefs.Count() == 1 && label->labelRefs.Head() != label->m_prev))
                {
                    if (this->cookieOpnd != nullptr)
                    {
                        this->cookieOpnd->Free(this->func);
                    }
                    this->baseOpnd = nullptr;
                    this->cookieOpnd = nullptr;
                    this->basePlusCookieOpnd = nullptr;
                }
            }
            continue;
        }

        IR::Opnd *src1 = instr->GetSrc1();
        IR::Opnd *src2 = instr->GetSrc2();
        IR::Opnd *dst = instr->GetDst();

        if (dst && this->baseOpnd && dst->IsEqual(this->baseOpnd))
        {
            if (this->cookieOpnd != nullptr)
            {
                this->cookieOpnd->Free(this->func);
            }
            this->baseOpnd = nullptr;
            this->cookieOpnd = nullptr;
            this->basePlusCookieOpnd = nullptr;
        }

        uint currInstrConstSize = 0;
        uint dstSize = dst ? CalculateConstSize(dst) : 0;
        uint src1Size = 0;
        uint src2Size = 0;
        if (src1)
        {
            src1Size = CalculateConstSize(src1);
            if (src2)
            {
                src2Size = CalculateConstSize(src2);
            }
        }

        prevInstrConstSize = currInstrConstSize;
        currInstrConstSize = dstSize + src1Size + src2Size;

        // we don't need to blind constants if user controlled byte size < 3
        if (currInstrConstSize + prevInstrConstSize <= 2 && !PHASE_FORCE1(Js::EncodeConstantsPhase))
        {
            continue;
        }

        bool isSrc1EqualDst = false;
        if (dstSize >= 2)
        {
            // don't count instrs where dst == src1 against size
            if (src1 && dstSize == src1Size && src1->IsEqual(dst))
            {
                currInstrConstSize -= dstSize;
                isSrc1EqualDst = true;

                if (currInstrConstSize + prevInstrConstSize <= 2 && !PHASE_FORCE1(Js::EncodeConstantsPhase))
                {
                    continue;
                }
            }

            this->EncodeOpnd(instr, dst);
            if (isSrc1EqualDst)
            {
                instr->ReplaceSrc1(dst);
            }
            currInstrConstSize -= dstSize;
            if (currInstrConstSize + prevInstrConstSize <= 2 && !PHASE_FORCE1(Js::EncodeConstantsPhase))
            {
                continue;
            }
        }
        if (src1Size >= 2 && !isSrc1EqualDst)
        {
            this->EncodeOpnd(instr, src1);
            currInstrConstSize -= src1Size;
            if (currInstrConstSize + prevInstrConstSize <= 2 && !PHASE_FORCE1(Js::EncodeConstantsPhase))
            {
                continue;
            }
        }
        if (src2Size >= 2)
        {
            this->EncodeOpnd(instr, src2);
            currInstrConstSize -= src2Size;
        }
    } NEXT_INSTR_IN_FUNC_EDITING;

}